

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_helper.h
# Opt level: O0

void integralEquationIteration<long_double>
               (QuickselectParams<long_double> *quickselectParams,
               vector<long_double,_std::allocator<long_double>_> *fOld,
               vector<long_double,_std::allocator<long_double>_> *fNewOut)

{
  uint uVar1;
  uint uVar2;
  size_type i_00;
  size_type nSamples;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  uint b;
  uint b_00;
  long extraout_RDX;
  long nSamples_00;
  long extraout_RDX_00;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST2;
  longdouble lVar12;
  longdouble x;
  longdouble in_ST3;
  longdouble lVar13;
  longdouble lVar14;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble summand_2;
  longdouble v_1;
  longdouble u_1;
  int local_230;
  int local_22c;
  int j2;
  int j1;
  longdouble sum_2;
  longdouble commonFactor_2;
  longdouble step2;
  longdouble step1;
  uint local_1d0;
  value_type local_1cc;
  uint t3;
  uint t2_2;
  uint local_1b0;
  int local_1ac;
  uint t1_2;
  int l;
  longdouble summand_1;
  longdouble v;
  int local_17c;
  undefined1 auStack_178 [4];
  int j_1;
  longdouble sum_1;
  longdouble commonFactor_1;
  longdouble step_1;
  uint local_130;
  value_type local_12c;
  uint t2_1;
  uint t1_1;
  longdouble summand;
  longdouble u;
  int local_fc;
  undefined1 auStack_f8 [4];
  int j;
  longdouble sum;
  longdouble commonFactor;
  longdouble step;
  uint local_ac;
  value_type local_a8;
  uint t2;
  uint t1;
  undefined1 auStack_98 [8];
  longdouble newValue;
  int local_84;
  undefined1 local_80 [4];
  int s;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t;
  longdouble alpha;
  int local_4c;
  int i;
  longdouble Delta;
  long LOld;
  long L;
  vector<long_double,_std::allocator<long_double>_> *fNewOut_local;
  vector<long_double,_std::allocator<long_double>_> *fOld_local;
  QuickselectParams<long_double> *quickselectParams_local;
  
  i_00 = std::vector<long_double,_std::allocator<long_double>_>::size(fNewOut);
  nSamples = std::vector<long_double,_std::allocator<long_double>_>::size(fOld);
  lVar7 = (longdouble)(1.0 / (double)(long)i_00);
  nSamples_00 = extraout_RDX;
  for (local_4c = 0; (long)local_4c < (long)i_00; local_4c = local_4c + 1) {
    alphaForIndex<long_double>((longdouble *)(long)local_4c,i_00,nSamples_00);
    unique0x100005bd = in_ST0;
    (*quickselectParams->_vptr_QuickselectParams[1])();
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    local_84 = (int)sVar3;
    (**quickselectParams->_vptr_QuickselectParams)();
    _auStack_98 = in_ST1;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,0);
    local_a8 = *pvVar4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&step + 8),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    uVar1 = tRight((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&step + 8),1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&step + 8));
    lVar8 = ((longdouble)1 - stack0xffffffffffffff98) * lVar7;
    lVar12 = in_ST6;
    unique0x100005a5 = lVar8;
    local_ac = uVar1;
    beta<long_double>((longdouble *)(ulong)(local_a8 + 1),uVar1 + 1,b);
    register0x00001110 = lVar8 / in_ST2;
    _auStack_f8 = (longdouble)0;
    for (local_fc = 0;
        (longdouble)local_fc < ((longdouble)1 - stack0xffffffffffffff98) / stack0xffffffffffffff28;
        local_fc = local_fc + 1) {
      register0x00001110 =
           (longdouble)local_fc * stack0xffffffffffffff28 +
           (longdouble)0.5 * stack0xffffffffffffff28 + stack0xffffffffffffff98;
      lVar9 = lVar12;
      lVar11 = lVar12;
      sVar3 = indexForAlpha<long_double>(stack0xffffffffffffff98 / register0x00001110,nSamples);
      pvVar5 = std::vector<long_double,_std::allocator<long_double>_>::operator[](fOld,sVar3);
      lVar8 = *(longdouble *)pvVar5;
      uVar1 = (uint)sVar3;
      pow<long_double>((longdouble *)(ulong)(local_a8 + 1),stack0xfffffffffffffee8,uVar1);
      lVar8 = in_ST3 * lVar8;
      in_ST3 = in_ST5;
      in_ST5 = lVar12;
      lVar12 = lVar11;
      pow<long_double>((longdouble *)(ulong)local_ac,(longdouble)1 - stack0xfffffffffffffee8,uVar1);
      _t2_1 = in_ST4 * lVar8;
      _auStack_f8 = _auStack_f8 + _t2_1;
      in_ST4 = in_ST6;
      in_ST6 = lVar9;
    }
    _auStack_98 = _auStack_f8 * stack0xffffffffffffff18 + _auStack_98;
    lVar8 = lVar12;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                        (long)(local_84 + -1));
    local_12c = *pvVar4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&step_1 + 8),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    uVar1 = tLeft((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&step_1 + 8),
                  local_84);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&step_1 + 8));
    lVar9 = stack0xffffffffffffff98 * lVar7;
    unique0x10000597 = lVar9;
    local_130 = uVar1;
    beta<long_double>((longdouble *)(ulong)(local_12c + 1),uVar1 + 1,b_00);
    register0x00001110 = lVar9 / in_ST3;
    _auStack_178 = (longdouble)0;
    for (local_17c = 0; (longdouble)local_17c < stack0xffffffffffffff98 / stack0xfffffffffffffea8;
        local_17c = local_17c + 1) {
      register0x00001110 =
           (longdouble)0 + (longdouble)0.5 * stack0xfffffffffffffea8 +
           (longdouble)local_17c * stack0xfffffffffffffea8;
      lVar11 = lVar8;
      sVar3 = indexForAlpha<long_double>
                        ((stack0xffffffffffffff98 - register0x00001110) /
                         ((longdouble)1 - register0x00001110),nSamples);
      pvVar5 = std::vector<long_double,_std::allocator<long_double>_>::operator[](fOld,sVar3);
      lVar9 = *(longdouble *)pvVar5;
      uVar1 = (uint)sVar3;
      lVar13 = lVar11;
      pow<long_double>((longdouble *)(ulong)(local_12c + 1),(longdouble)1 - stack0xfffffffffffffe68,
                       uVar1);
      lVar9 = in_ST4 * lVar9;
      in_ST4 = in_ST6;
      in_ST6 = lVar8;
      lVar8 = lVar13;
      pow<long_double>((longdouble *)(ulong)local_130,stack0xfffffffffffffe68,uVar1);
      _t1_2 = in_ST5 * lVar9;
      _auStack_178 = _auStack_178 + _t1_2;
      in_ST5 = lVar12;
      lVar12 = lVar11;
    }
    _auStack_98 = _auStack_178 * stack0xfffffffffffffe98 + _auStack_98;
    in_ST0 = in_ST4;
    in_ST1 = in_ST5;
    in_ST2 = in_ST6;
    in_ST3 = lVar12;
    in_ST4 = lVar8;
    for (local_1ac = 2; lVar12 = _auStack_98, uVar1 = local_84 - 1, local_1ac <= (int)uVar1;
        local_1ac = local_1ac + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&t3,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
      uVar2 = tLeft((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&t3,local_1ac);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&t3);
      local_1b0 = uVar2;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                          (long)(local_1ac + -1));
      local_1cc = *pvVar4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&step1 + 8),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
      uVar2 = tRight((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&step1 + 8),
                     local_1ac);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&step1 + 8));
      lVar8 = stack0xffffffffffffff98 * lVar7;
      lVar9 = ((longdouble)1 - stack0xffffffffffffff98) * lVar7;
      lVar12 = in_ST4;
      local_1d0 = uVar2;
      beta<long_double>((longdouble *)(ulong)(local_1b0 + 1),local_1cc + 1,uVar2 + 1,uVar1);
      _j2 = (longdouble)0;
      for (local_22c = 0; (longdouble)local_22c < stack0xffffffffffffff98 / lVar8;
          local_22c = local_22c + 1) {
        for (local_230 = 0;
            (longdouble)local_230 < ((longdouble)1 - stack0xffffffffffffff98) / lVar9;
            local_230 = local_230 + 1) {
          x = (longdouble)0 + lVar8 * (longdouble)0.5 + (longdouble)local_22c * lVar8;
          lVar10 = (longdouble)local_230 * lVar9 + stack0xffffffffffffff98 + (longdouble)0.5 * lVar9
          ;
          lVar13 = in_ST4;
          lVar14 = in_ST4;
          lVar12 = in_ST4;
          sVar3 = indexForAlpha<long_double>((stack0xffffffffffffff98 - x) / (lVar10 - x),nSamples);
          pvVar5 = std::vector<long_double,_std::allocator<long_double>_>::operator[](fOld,sVar3);
          lVar11 = *(longdouble *)pvVar5;
          uVar1 = (uint)sVar3;
          pow<long_double>((longdouble *)(ulong)local_1b0,x,uVar1);
          lVar11 = in_ST1 * lVar11;
          in_ST1 = in_ST4;
          in_ST4 = lVar12;
          pow<long_double>((longdouble *)(ulong)(local_1cc + 1),lVar10 - x,uVar1);
          lVar11 = in_ST2 * lVar11;
          in_ST2 = lVar13;
          pow<long_double>((longdouble *)(ulong)local_1d0,(longdouble)1 - lVar10,uVar1);
          _j2 = _j2 + in_ST3 * lVar11;
          in_ST3 = lVar14;
        }
      }
      _auStack_98 = _j2 * ((lVar9 * lVar8) / in_ST0) + _auStack_98;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = lVar12;
    }
    in_ST5 = in_ST4;
    in_ST6 = in_ST4;
    pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                       (fNewOut,(long)local_4c);
    *(longdouble *)pvVar6 = lVar12;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    nSamples_00 = extraout_RDX_00;
  }
  return;
}

Assistant:

void integralEquationIteration(const QuickselectParams<Num> * quickselectParams,
                               const vector<Num> & fOld, vector<Num> & fNewOut) {
	const long L = fNewOut.size();
	const long LOld = fOld.size();
	const Num Delta = 1.0 / L;

	for (int i = 0; i < L; ++i) {
		auto alpha = alphaForIndex<Num>(i, L);
		const vector<unsigned int> t = quickselectParams->samplingParameter(alpha);
		auto s = static_cast<int>(t.size());

		// partitioning costs
		Num newValue = quickselectParams->partitioningCosts(alpha);
		// first integral (left call)
		{
			const unsigned int t1 = t[0], t2 = tRight(t, 1) ;
			Num step = Delta * (1 - alpha);
			const Num commonFactor = step / beta<Num>(t1 + 1, t2 + 1);
			Num sum = 0;
			for (int j = 0; j < (1-alpha) / step; ++j) {
				Num u = alpha + step/2 + j*step;
//			}
//			for (Num u = alpha + step / 2; u < 1; u += step) {
				Num summand = fOld[indexForAlpha(alpha / u, LOld)]
				              * pow(u,t1+1) * pow(1-u,t2);
				sum += summand;
			}
			newValue += sum * commonFactor;
		}
		// second integral (right call)
		{
			const unsigned int t1 = t[s-1], t2 = tLeft(t, s) ;
			Num step = Delta * alpha;
			const Num commonFactor = step / beta<Num>(t1 + 1, t2 + 1);
			Num sum = 0;
			for (int j = 0; j < alpha / step; ++j) {
				Num v = 0 + step/2 + j*step;
//			for (Num v = 0 + step / 2; v < alpha; v += step) {
				Num summand = fOld[indexForAlpha((alpha-v) / (1-v), LOld)]
				              * pow(1-v,t1+1) * pow(v,t2);
				sum += summand;
			}
			newValue += sum * commonFactor;
		}
		// third integrals (middle calls)
		for (int l = 2; l <= s-1; ++l) {
			const unsigned int t1 = tLeft(t,l), t2 = t[l-1], t3 = tRight(t,l) ;
			Num step1 = Delta * alpha, step2 = Delta * (1-alpha);
			const Num commonFactor = step1 * step2 / beta<Num>(t1 + 1, t2 + 1, t3 + 1);
			Num sum = 0;
			for (int j1 = 0; j1 < alpha / step1; ++j1) {
				for (int j2 = 0; j2 < (1 - alpha) / step2; ++j2) {
					Num u = 0 + step1 / 2 + j1 * step1;
					Num v = alpha + step2 / 2 + j2 * step2;
					Num summand = fOld[indexForAlpha((alpha - u) / (v - u), LOld)]
					              * pow(u,t1) * pow(v - u, t2 + 1) * pow(1-v, t3) ;
					sum += summand;
				}
			}
			newValue += sum * commonFactor;
		}

		fNewOut[i] = newValue;
	}

}